

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token __thiscall
slang::parsing::Lexer::create<slang::LiteralBase&,bool>
          (Lexer *this,TokenKind kind,LiteralBase *args,bool *args_1)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  BumpAllocator *alloc;
  string_view rawText;
  int iVar4;
  undefined4 extraout_var;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  Token local_40;
  
  uVar1 = (this->bufferId).id;
  pcVar2 = this->marker;
  pcVar3 = this->originalBegin;
  alloc = this->alloc;
  iVar4 = SmallVectorBase<slang::parsing::Trivia>::copy
                    (&(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>,
                     (EVP_PKEY_CTX *)alloc,(EVP_PKEY_CTX *)args);
  trivia._M_ptr._4_4_ = extraout_var;
  trivia._M_ptr._0_4_ = iVar4;
  rawText._M_str = this->marker;
  rawText._M_len = (ulong)(uint)(*(int *)&this->sourceBuffer - (int)this->marker);
  trivia._M_extent._M_extent_value = extraout_RDX._M_extent_value;
  Token::Token(&local_40,alloc,kind,trivia,rawText,
               (SourceLocation)
               (((long)pcVar2 - (long)pcVar3) * 0x10000000 | (ulong)(uVar1 & 0xfffffff)),*args,
               *args_1);
  return local_40;
}

Assistant:

Token Lexer::create(TokenKind kind, Args&&... args) {
    SourceLocation location(bufferId, size_t(marker - originalBegin));
    return Token(alloc, kind, triviaBuffer.copy(alloc), lexeme(), location,
                 std::forward<Args>(args)...);
}